

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O2

cram_record * cram_get_seq(cram_fd *fd)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  int iVar2;
  void *pvVar3;
  cram_block_slice_hdr *pcVar4;
  cram_record *pcVar5;
  cram_slice *pcVar6;
  int iVar7;
  cram_container *c;
  cram_block *pcVar8;
  cram_block_compression_hdr *pcVar9;
  t_pool_result *r;
  cram_slice *pcVar10;
  
  __mutex = &fd->ref_lock;
  do {
    c = fd->ctr;
    if (c == (cram_container *)0x0) {
      do {
        c = cram_read_container(fd);
        fd->ctr = c;
        if (c == (cram_container *)0x0) {
          return (cram_record *)0x0;
        }
        iVar7 = c->length;
      } while (iVar7 == 0);
      if ((fd->range).refid != -2) {
        while (iVar2 = c->ref_seq_id, iVar2 != -2) {
          iVar1 = (fd->range).refid;
          if ((iVar1 <= iVar2) && ((fd->range).start < c->ref_seq_span + c->ref_seq_start)) {
            if (iVar2 != iVar1) {
              return (cram_record *)0x0;
            }
            break;
          }
          iVar7 = cram_seek(fd,(long)iVar7,1);
          if (iVar7 != 0) {
            return (cram_record *)0x0;
          }
          cram_free_container(fd->ctr);
          do {
            c = cram_read_container(fd);
            fd->ctr = c;
            if (c == (cram_container *)0x0) {
              return (cram_record *)0x0;
            }
            iVar7 = c->length;
          } while (iVar7 == 0);
        }
      }
      pcVar8 = cram_read_block(fd);
      c->comp_hdr_block = pcVar8;
      if ((pcVar8 != (cram_block *)0x0) && (pcVar8->content_type == COMPRESSION_HEADER)) {
        pcVar9 = cram_decode_compression_header(fd,pcVar8);
        c->comp_hdr = pcVar9;
        if (pcVar9 != (cram_block_compression_hdr *)0x0) {
          if (pcVar9->AP_delta == 0) {
            pthread_mutex_lock((pthread_mutex_t *)__mutex);
            fd->unsorted = 1;
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          }
          goto LAB_00119911;
        }
      }
      return (cram_record *)0x0;
    }
    pcVar10 = c->slice;
    if ((pcVar10 == (cram_slice *)0x0) || (c->max_rec <= c->curr_rec)) {
LAB_00119911:
      pcVar10 = c->slice;
      if (pcVar10 != (cram_slice *)0x0) {
        c->slice = (cram_slice *)0x0;
        cram_free_slice(pcVar10);
      }
      pcVar10 = (cram_slice *)0x0;
      pcVar6 = (cram_slice *)0x0;
      if (c->curr_slice != c->max_slice) goto LAB_00119950;
LAB_0011993f:
      cram_free_container(c);
      c = (cram_container *)0x0;
      pcVar6 = pcVar10;
LAB_00119950:
      pcVar10 = pcVar6;
      pvVar3 = fd->job_pending;
      if (pvVar3 != (void *)0x0) {
        c = *(cram_container **)((long)pvVar3 + 8);
        pcVar10 = *(cram_slice **)((long)pvVar3 + 0x10);
        free(pvVar3);
        fd->job_pending = (void *)0x0;
        goto LAB_00119ae0;
      }
      if (fd->ooc != 0) goto LAB_00119ae0;
      while( true ) {
        if ((c == (cram_container *)0x0) || (c->curr_slice == c->max_slice)) {
          do {
            c = cram_read_container(fd);
            fd->ctr = c;
            if (c == (cram_container *)0x0) {
              if (fd->pool == (t_pool *)0x0) {
                return (cram_record *)0x0;
              }
              fd->ooc = 1;
              goto LAB_00119b8a;
            }
            iVar7 = c->length;
          } while ((long)iVar7 == 0);
          if (fd->ooc != 0) goto LAB_00119cb2;
          iVar2 = (fd->range).refid;
          if ((iVar2 != -2) && (iVar1 = c->ref_seq_id, iVar1 != -2)) {
            *(byte *)&fd->required_fields = (byte)fd->required_fields | 8;
            if ((iVar1 != iVar2) || ((fd->range).end < c->ref_seq_start)) {
              cram_free_container(c);
              fd->ctr = (cram_container *)0x0;
              fd->ooc = 1;
              fd->eof = 1;
              goto LAB_00119cb2;
            }
            if (c->ref_seq_start + c->ref_seq_span <= (fd->range).start) {
              c->curr_rec = c->max_rec;
              c->curr_slice = c->max_slice;
              cram_seek(fd,(long)iVar7,1);
              cram_free_container(c);
              c = (cram_container *)0x0;
              pcVar6 = pcVar10;
              goto LAB_00119950;
            }
          }
          pcVar8 = cram_read_block(fd);
          c->comp_hdr_block = pcVar8;
          if (pcVar8 == (cram_block *)0x0) {
            return (cram_record *)0x0;
          }
          if (pcVar8->content_type != COMPRESSION_HEADER) {
            return (cram_record *)0x0;
          }
          pcVar9 = cram_decode_compression_header(fd,pcVar8);
          c->comp_hdr = pcVar9;
          if (pcVar9 == (cram_block_compression_hdr *)0x0) {
            return (cram_record *)0x0;
          }
          if (pcVar9->AP_delta == 0) {
            pthread_mutex_lock((pthread_mutex_t *)__mutex);
            fd->unsorted = 1;
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          }
        }
        if (c->num_records != 0) break;
        cram_free_container(c);
        c = (cram_container *)0x0;
      }
      pcVar10 = cram_read_slice(fd);
      c->slice = pcVar10;
      if (pcVar10 == (cram_slice *)0x0) {
        return (cram_record *)0x0;
      }
      c->curr_slice = c->curr_slice + 1;
      c->curr_rec = 0;
      pcVar4 = pcVar10->hdr;
      c->max_rec = pcVar4->num_records;
      iVar7 = pcVar4->ref_seq_start;
      pcVar10->last_apos = iVar7;
      iVar2 = (fd->range).refid;
      if ((iVar2 != -2) && (pcVar4->ref_seq_id != -2)) {
        if ((pcVar4->ref_seq_id != iVar2) || ((fd->range).end < iVar7)) goto LAB_00119d0c;
        if (iVar7 + pcVar4->ref_seq_span <= (fd->range).start) break;
      }
LAB_00119ae0:
      if ((c == (cram_container *)0x0) || (pcVar10 == (cram_slice *)0x0)) {
LAB_00119cb2:
        if (fd->pool == (t_pool *)0x0) goto LAB_00119bd6;
      }
      else {
        iVar7 = cram_decode_slice_mt(fd,c,pcVar10,fd->header);
        if (iVar7 != 0) {
          fwrite("Failure to decode slice\n",0x18,1,_stderr);
          goto LAB_00119d16;
        }
        if (fd->pool == (t_pool *)0x0) goto LAB_00119bdf;
        if ((fd->job_pending == (void *)0x0) &&
           (iVar7 = t_pool_results_queue_len(fd->rqueue), pcVar6 = pcVar10, iVar7 <= fd->pool->qsize
           )) goto LAB_00119950;
      }
      if (fd->ooc != 0) {
LAB_00119b8a:
        iVar7 = t_pool_results_queue_empty(fd->rqueue);
        if (iVar7 != 0) {
          return (cram_record *)0x0;
        }
      }
      r = t_pool_next_result_wait(fd->rqueue);
      if ((r == (t_pool_result *)0x0) || (pvVar3 = r->data, pvVar3 == (void *)0x0)) {
        fwrite("t_pool_next_result failure\n",0x1b,1,_stderr);
        return (cram_record *)0x0;
      }
      c = *(cram_container **)((long)pvVar3 + 8);
      pcVar10 = *(cram_slice **)((long)pvVar3 + 0x10);
      fd->ctr = c;
      t_pool_delete_result(r,1);
LAB_00119bd6:
      if (pcVar10 == (cram_slice *)0x0) {
        return (cram_record *)0x0;
      }
    }
LAB_00119bdf:
    iVar7 = (fd->range).refid;
    pcVar5 = pcVar10->crecs;
    iVar2 = c->curr_rec;
    if (iVar7 == -2) {
LAB_00119cf1:
      fd->ctr = c;
      c->slice = pcVar10;
      c->curr_rec = iVar2 + 1;
      return pcVar5 + iVar2;
    }
    if (iVar7 <= pcVar5[iVar2].ref_id) {
      if ((pcVar5[iVar2].ref_id != iVar7) || ((fd->range).end < pcVar5[iVar2].apos)) {
LAB_00119d0c:
        fd->eof = 1;
LAB_00119d16:
        cram_free_slice(pcVar10);
        c->slice = (cram_slice *)0x0;
        return (cram_record *)0x0;
      }
      if ((fd->range).start <= pcVar5[iVar2].aend) goto LAB_00119cf1;
    }
    c->curr_rec = iVar2 + 1;
  } while( true );
  cram_free_slice(pcVar10);
  c->slice = (cram_slice *)0x0;
  goto LAB_0011993f;
}

Assistant:

cram_record *cram_get_seq(cram_fd *fd) {
    cram_container *c;
    cram_slice *s;

    for (;;) {
	c = fd->ctr;
	if (c && c->slice && c->curr_rec < c->max_rec) {
	    s = c->slice;
	} else {
	    if (!(s = cram_next_slice(fd, &c)))
		return NULL;
	}

	if (fd->range.refid != -2) {
	    if (s->crecs[c->curr_rec].ref_id < fd->range.refid) {
		c->curr_rec++;
		continue;
	    }

	    if (s->crecs[c->curr_rec].ref_id != fd->range.refid) {
		fd->eof = 1;
		cram_free_slice(s);
		c->slice = NULL;
		return NULL;
	    }

	    if (s->crecs[c->curr_rec].apos > fd->range.end) {
		fd->eof = 1;
		cram_free_slice(s);
		c->slice = NULL;
		return NULL;
	    }

	    if (s->crecs[c->curr_rec].aend < fd->range.start) {
		c->curr_rec++;
		continue;
	    }
	}

	break;
    }

    fd->ctr = c;
    c->slice = s;
    return &s->crecs[c->curr_rec++];
}